

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::disp_data_source_t::distribute_value_for_work_thread
          (disp_data_source_t *this,mbox_t *mbox,string *group_name,thread_with_refcounter_t *wt)

{
  char *pcVar1;
  ostream *poVar2;
  element_type *peVar3;
  size_t local_218;
  suffix_t local_210;
  suffix_t local_208;
  string local_200 [36];
  undefined1 local_1dc [8];
  prefix_t prefix;
  ostringstream local_1a0 [8];
  ostringstream ss;
  thread_with_refcounter_t *wt_local;
  string *group_name_local;
  mbox_t *mbox_local;
  disp_data_source_t *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar1 = stats::prefix_t::c_str(&this->m_base_prefix);
  poVar2 = std::operator<<((ostream *)local_1a0,pcVar1);
  poVar2 = std::operator<<(poVar2,"/wt-");
  std::operator<<(poVar2,(string *)group_name);
  std::__cxx11::ostringstream::str();
  stats::prefix_t::prefix_t((prefix_t *)local_1dc,local_200);
  std::__cxx11::string::~string((string *)local_200);
  local_208 = stats::suffixes::agent_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long_const&>
            (mbox,(prefix_t *)local_1dc,&local_208,&wt->m_user_agent);
  local_210 = stats::suffixes::work_thread_queue_size();
  peVar3 = std::
           __shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)wt);
  local_218 = reuse::work_thread::details::
              work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
              ::demands_count(peVar3);
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long>
            (mbox,(prefix_t *)local_1dc,&local_210,&local_218);
  peVar3 = std::
           __shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)wt);
  anon_unknown_7::send_thread_activity_stats(mbox,(prefix_t *)local_1dc,peVar3);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void
				distribute_value_for_work_thread(
					const so_5::mbox_t & mbox,
					const std::string & group_name,
					const thread_with_refcounter_t & wt )
					{
						std::ostringstream ss;
						ss << m_base_prefix.c_str() << "/wt-" << group_name;

						const stats::prefix_t prefix{ ss.str() };

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::agent_count(),
								wt.m_user_agent );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::work_thread_queue_size(),
								wt.m_thread->demands_count() );

						send_thread_activity_stats(
								mbox,
								prefix,
								*(wt.m_thread) );
					}